

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDCFromMemory
               (uint8_t *addr,size_t length,string *filename,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  bool bVar1;
  ulong __val;
  USDCReader reader;
  StreamReader sr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [32];
  USDCReaderConfig local_78;
  string local_50;
  
  if (stage == (Stage *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
  }
  else {
    __val = (long)options->max_memory_limit_in_mb << 0x14;
    if (length <= __val) {
      local_98[0x10] = '\0';
      local_98._24_8_ = 0;
      local_78.kMaxPrimNestLevel = 0x100;
      local_78.kMaxFieldValuePairs = 0x1000;
      local_78.kMaxTokenLength = 0x1000;
      local_78.kMaxStringLength = 0x4000000;
      local_78.kMaxElementSize = 0x2000;
      local_78.kMaxAllowedMemoryInMB = 0x4000;
      local_78.allow_unknown_prims = true;
      local_78.allow_unknown_apiSchemas = true;
      local_78.numThreads = options->num_threads;
      local_78.strict_allowedToken_check = options->strict_allowedToken_check;
      local_98._0_8_ = addr;
      local_98._8_8_ = length;
      usdc::USDCReader::USDCReader((USDCReader *)&bStack_138,(StreamReader *)local_98,&local_78);
      bVar1 = usdc::USDCReader::ReadUSDC((USDCReader *)&bStack_138);
      if ((bVar1) &&
         (bVar1 = usdc::USDCReader::ReconstructStage((USDCReader *)&bStack_138,stage), bVar1)) {
        if (warn != (string *)0x0) {
          usdc::USDCReader::GetWarning_abi_cxx11_(&local_118,(USDCReader *)&bStack_138);
          ::std::__cxx11::string::operator=((string *)warn,(string *)&local_118);
          ::std::__cxx11::string::_M_dispose();
        }
        bVar1 = true;
        if (err != (string *)0x0) {
          usdc::USDCReader::GetError_abi_cxx11_(&local_118,(USDCReader *)&bStack_138);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_118);
          ::std::__cxx11::string::_M_dispose();
        }
      }
      else {
        if (warn != (string *)0x0) {
          usdc::USDCReader::GetWarning_abi_cxx11_(&local_118,(USDCReader *)&bStack_138);
          ::std::__cxx11::string::operator=((string *)warn,(string *)&local_118);
          ::std::__cxx11::string::_M_dispose();
        }
        if (err != (string *)0x0) {
          usdc::USDCReader::GetError_abi_cxx11_(&local_118,(USDCReader *)&bStack_138);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_118);
          ::std::__cxx11::string::_M_dispose();
        }
        bVar1 = false;
      }
      usdc::USDCReader::~USDCReader((USDCReader *)&bStack_138);
      return bVar1;
    }
    if (err != (string *)0x0) {
      ::std::operator+(&local_d8,"USDC data [",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename
                      );
      ::std::operator+(&local_b8,&local_d8,"] is too large(size = ");
      std::__cxx11::to_string(&local_f8,length);
      ::std::operator+(&bStack_138,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,&local_f8);
      ::std::operator+(&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bStack_138,", which exceeds memory limit ");
      std::__cxx11::to_string(&local_50,__val);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_118,&local_50);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,".\n");
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  return false;
}

Assistant:

bool LoadUSDCFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  if (stage == nullptr) {
    if (err) {
      (*err) = "null pointer for `stage` argument.\n";
    }
    return false;
  }

  bool swap_endian = false;  // @FIXME

  size_t max_length;

  // 32bit env
  if (sizeof(void *) == 4) {
    if (options.max_memory_limit_in_mb > 4096) {  // exceeds 4GB
      max_length = std::numeric_limits<uint32_t>::max();
    } else {
      max_length =
          size_t(1024) * size_t(1024) * size_t(options.max_memory_limit_in_mb);
    }
  } else {
    // TODO: Set hard limit?
    max_length =
        size_t(1024) * size_t(1024) * size_t(options.max_memory_limit_in_mb);
  }

  DCOUT("Max length = " << max_length);

  if (length > max_length) {
    if (err) {
      (*err) += "USDC data [" + filename +
                "] is too large(size = " + std::to_string(length) +
                ", which exceeds memory limit " + std::to_string(max_length) +
                ".\n";
    }

    return false;
  }

  StreamReader sr(addr, length, swap_endian);

  usdc::USDCReaderConfig config;
  config.numThreads = options.num_threads;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  usdc::USDCReader reader(&sr, config);

  if (!reader.ReadUSDC()) {
    if (warn) {
      (*warn) = reader.GetWarning();
    }

    if (err) {
      (*err) = reader.GetError();
    }
    return false;
  }

  DCOUT("Loaded USDC file.");

  // Reconstruct `Stage`(scene) object
  {
    if (!reader.ReconstructStage(stage)) {
      DCOUT("Failed to reconstruct Stage from Crate.");
      if (warn) {
        (*warn) = reader.GetWarning();
      }

      if (err) {
        (*err) = reader.GetError();
      }
      return false;
    }
  }

  if (warn) {
    (*warn) = reader.GetWarning();
  }

  // Reconstruct OK but may have some error.
  // TODO(syoyo): Return false in strict mode.
  if (err) {
    DCOUT(reader.GetError());
    (*err) = reader.GetError();
  }

  DCOUT("Reconstructed Stage from USDC file.");

  return true;
}